

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reverb.cpp
# Opt level: O0

void anon_unknown.dwarf_15ef52::StdReverb_getParami(EffectProps *props,ALenum param,int *val)

{
  effect_exception *this;
  uint *in_RDX;
  uint in_ESI;
  long in_RDI;
  
  if (in_ESI == 0xd) {
    *in_RDX = (uint)(*(byte *)(in_RDI + 0x30) & 1);
    return;
  }
  this = (effect_exception *)__cxa_allocate_exception(0x30);
  effect_exception::effect_exception
            (this,0xa002,"Invalid reverb integer property 0x%04x",(ulong)in_ESI);
  __cxa_throw(this,&effect_exception::typeinfo,effect_exception::~effect_exception);
}

Assistant:

void StdReverb_getParami(const EffectProps *props, ALenum param, int *val)
{
    switch(param)
    {
    case AL_REVERB_DECAY_HFLIMIT:
        *val = props->Reverb.DecayHFLimit;
        break;

    default:
        throw effect_exception{AL_INVALID_ENUM, "Invalid reverb integer property 0x%04x", param};
    }
}